

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O0

long mem_ctrl(BIO *bio,int cmd,long num,void *ptr)

{
  long *plVar1;
  int iVar2;
  BUF_MEM **out_1;
  char **out;
  BUF_MEM *b;
  void *ptr_local;
  long num_local;
  int cmd_local;
  BIO *bio_local;
  
  plVar1 = (long *)bio->ptr;
  if (cmd == 1) {
    if (plVar1[1] != 0) {
      if ((bio->flags & 0x200U) == 0) {
        OPENSSL_memset((void *)plVar1[1],0,plVar1[2]);
        *plVar1 = 0;
      }
      else {
        plVar1[1] = plVar1[1] - (plVar1[2] - *plVar1);
        *plVar1 = plVar1[2];
      }
    }
    bio_local = (BIO *)0x1;
  }
  else if (cmd == 2) {
    bio_local = (BIO *)(ulong)(*plVar1 == 0);
  }
  else if (cmd == 3) {
    if (ptr != (void *)0x0) {
      *(long *)ptr = plVar1[1];
    }
    bio_local = (BIO *)*plVar1;
  }
  else if (cmd == 8) {
    bio_local = (BIO *)(long)bio->shutdown;
  }
  else {
    iVar2 = (int)num;
    if (cmd == 9) {
      bio->shutdown = iVar2;
      bio_local = (BIO *)0x1;
    }
    else if (cmd == 10) {
      bio_local = (BIO *)*plVar1;
    }
    else if (cmd == 0xb) {
      bio_local = (BIO *)0x1;
    }
    else if (cmd == 0xd) {
      bio_local = (BIO *)0x0;
    }
    else if (cmd == 0x72) {
      mem_free(bio);
      bio->shutdown = iVar2;
      bio->ptr = ptr;
      bio_local = (BIO *)0x1;
    }
    else if (cmd == 0x73) {
      if (ptr != (void *)0x0) {
        *(long **)ptr = plVar1;
      }
      bio_local = (BIO *)0x1;
    }
    else if (cmd == 0x82) {
      bio->num = iVar2;
      bio_local = (BIO *)0x1;
    }
    else {
      bio_local = (BIO *)0x0;
    }
  }
  return (long)bio_local;
}

Assistant:

static long mem_ctrl(BIO *bio, int cmd, long num, void *ptr) {
  BUF_MEM *b = static_cast<BUF_MEM *>(bio->ptr);
  switch (cmd) {
    case BIO_CTRL_RESET:
      if (b->data != NULL) {
        // For read only case reset to the start again
        if (bio->flags & BIO_FLAGS_MEM_RDONLY) {
          b->data -= b->max - b->length;
          b->length = b->max;
        } else {
          OPENSSL_memset(b->data, 0, b->max);
          b->length = 0;
        }
      }
      return 1;
    case BIO_CTRL_EOF:
      return b->length == 0;
    case BIO_C_SET_BUF_MEM_EOF_RETURN:
      bio->num = static_cast<int>(num);
      return 1;
    case BIO_CTRL_INFO:
      if (ptr != nullptr) {
        char **out = reinterpret_cast<char **>(ptr);
        *out = b->data;
      }
      // This API can overflow on 64-bit Windows, where |long| is smaller than
      // |ptrdiff_t|. |BIO_mem_contents| is the overflow-safe API.
      return static_cast<long>(b->length);
    case BIO_C_SET_BUF_MEM:
      mem_free(bio);
      bio->shutdown = static_cast<int>(num);
      bio->ptr = ptr;
      return 1;
    case BIO_C_GET_BUF_MEM_PTR:
      if (ptr != NULL) {
        BUF_MEM **out = reinterpret_cast<BUF_MEM **>(ptr);
        *out = b;
      }
      return 1;
    case BIO_CTRL_GET_CLOSE:
      return bio->shutdown;
    case BIO_CTRL_SET_CLOSE:
      bio->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_WPENDING:
      return 0;
    case BIO_CTRL_PENDING:
      // TODO(crbug.com/412584975): This can overflow on 64-bit Windows.
      return static_cast<long>(b->length);
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}